

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::SourceCodeInfo_Location::_InternalSerialize
          (SourceCodeInfo_Location *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  _func_int **pp_Var1;
  SourceCodeInfo_Location *pSVar2;
  ptrdiff_t pVar3;
  uint32_t num;
  EpsCopyOutputStream *pEVar4;
  bool bVar5;
  int iVar6;
  const_pointer piVar7;
  LogMessage *pLVar8;
  uint32_t *puVar9;
  char *pcVar10;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  void *__src;
  UnknownFieldSet *unknown_fields;
  byte *__dest;
  string_view sVar11;
  string_view local_2c0;
  const_reference local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  int n;
  int i;
  char *local_298;
  string_view local_290;
  string *local_280;
  string *_s_1;
  char *local_270;
  string_view local_268;
  string *local_258;
  string *_s;
  uint local_248;
  int byte_size_1;
  int byte_size;
  uint32_t cached_has_bits;
  SourceCodeInfo_Location *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  SourceCodeInfo_Location *this_local;
  char *local_218;
  size_t local_210;
  ptrdiff_t size;
  const_reference local_200;
  uint32_t local_1f4;
  SourceCodeInfo_Location *local_1f0;
  EpsCopyOutputStream *local_1e8;
  EpsCopyOutputStream *local_1e0;
  uint local_1d4;
  RepeatedField<int> *local_1d0;
  undefined4 local_1c4;
  SourceCodeInfo_Location *local_1c0;
  EpsCopyOutputStream *local_1b8;
  uint local_1ac;
  RepeatedField<int> *local_1a8;
  undefined4 local_19c;
  SourceCodeInfo_Location *local_198;
  byte *local_190;
  uint local_184;
  const_pointer local_180;
  const_pointer end;
  const_pointer it;
  EpsCopyOutputStream *local_168;
  uint local_15c;
  RepeatedField<int> *local_158;
  int local_14c;
  SourceCodeInfo_Location *local_148;
  EpsCopyOutputStream *local_140;
  ulong local_138;
  const_pointer local_130;
  const_pointer end_1;
  const_pointer it_1;
  EpsCopyOutputStream *local_118;
  uint local_10c;
  RepeatedField<int> *local_108;
  int local_fc;
  SourceCodeInfo_Location *local_f8;
  EpsCopyOutputStream *local_f0;
  ulong local_e8;
  _func_int **local_e0;
  uint local_d8;
  int local_d4;
  SourceCodeInfo_Location *local_d0;
  _func_int **local_c8;
  uint local_c0;
  int local_bc;
  SourceCodeInfo_Location *local_b8;
  byte local_a9;
  LogMessage local_a8;
  Voidify local_91;
  _func_int **local_90;
  uint local_88;
  int local_84;
  SourceCodeInfo_Location *local_80;
  _func_int **local_78;
  uint local_70;
  byte local_69;
  LogMessage local_68;
  Voidify local_51;
  _func_int **local_50;
  uint local_48;
  int local_44;
  SourceCodeInfo_Location *local_40;
  _func_int **local_38;
  uint local_2c;
  EpsCopyOutputStream *local_28;
  uint local_1c;
  EpsCopyOutputStream *local_18;
  uint local_c;
  
  byte_size_1 = 0;
  _byte_size = this;
  this_ = (SourceCodeInfo_Location *)stream;
  stream_local = (EpsCopyOutputStream *)target;
  target_local = (uint8_t *)this;
  local_248 = internal::CachedSize::Get(&(this->field_0)._impl_._path_cached_byte_size_);
  pSVar2 = this_;
  pEVar4 = stream_local;
  if (0 < (int)local_248) {
    local_1a8 = _internal_path(_byte_size);
    local_198 = pSVar2;
    local_19c = 1;
    local_1ac = local_248;
    local_1b8 = stream_local;
    local_148 = pSVar2;
    local_14c = 1;
    local_15c = local_248;
    local_168 = stream_local;
    it = (const_pointer)io::EpsCopyOutputStream::Encode64;
    local_158 = local_1a8;
    local_168 = (EpsCopyOutputStream *)
                io::EpsCopyOutputStream::EnsureSpace
                          ((EpsCopyOutputStream *)pSVar2,(uint8_t *)stream_local);
    local_b8 = pSVar2;
    local_bc = local_14c;
    local_c0 = local_15c;
    local_80 = pSVar2;
    local_84 = local_14c;
    local_88 = 2;
    local_a9 = 0;
    local_c8 = (_func_int **)local_168;
    local_90 = (_func_int **)local_168;
    if ((pSVar2->super_Message).super_MessageLite._vptr_MessageLite <= local_168) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      local_a9 = 1;
      pLVar8 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_a8);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_91,pLVar8);
    }
    if ((local_a9 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_a8);
    }
    local_78 = local_90;
    for (local_70 = local_84 << 3 | local_88; 0x7f < local_70; local_70 = local_70 >> 7) {
      *(byte *)local_78 = (byte)local_70 | 0x80;
      local_78 = (_func_int **)((long)local_78 + 1);
    }
    local_c8 = (_func_int **)((long)local_78 + 1);
    *(byte *)local_78 = (byte)local_70;
    local_28 = (EpsCopyOutputStream *)local_c8;
    for (local_1c = local_c0; 0x7f < local_1c; local_1c = local_1c >> 7) {
      *(byte *)local_28 = (byte)local_1c | 0x80;
      local_28 = (EpsCopyOutputStream *)((long)local_28 + 1);
    }
    local_168 = (EpsCopyOutputStream *)((long)local_28 + 1);
    *(byte *)local_28 = (byte)local_1c;
    local_78 = local_c8;
    local_28 = local_168;
    piVar7 = RepeatedField<int>::data(local_158);
    end = piVar7;
    iVar6 = RepeatedField<int>::size(local_158);
    local_180 = piVar7 + iVar6;
    do {
      local_168 = (EpsCopyOutputStream *)
                  io::EpsCopyOutputStream::EnsureSpace
                            ((EpsCopyOutputStream *)pSVar2,(uint8_t *)local_168);
      iVar6 = *end;
      end = end + 1;
      local_138 = (*(code *)it)((long)iVar6);
      local_140 = local_168;
      for (; 0x7f < local_138; local_138 = local_138 >> 7) {
        *(byte *)local_140 = (byte)local_138 | 0x80;
        local_140 = (EpsCopyOutputStream *)((long)local_140 + 1);
      }
      local_168 = (EpsCopyOutputStream *)((long)local_140 + 1);
      *(byte *)local_140 = (byte)local_138;
      pEVar4 = local_168;
      local_140 = local_168;
    } while (end < local_180);
  }
  stream_local = pEVar4;
  _s._4_4_ = internal::CachedSize::Get(&(_byte_size->field_0)._impl_._span_cached_byte_size_);
  pSVar2 = this_;
  pEVar4 = stream_local;
  if (0 < (int)_s._4_4_) {
    local_1d0 = _internal_span(_byte_size);
    local_1c0 = pSVar2;
    local_1c4 = 2;
    local_1d4 = _s._4_4_;
    local_1e0 = stream_local;
    local_f8 = pSVar2;
    local_fc = 2;
    local_10c = _s._4_4_;
    local_118 = stream_local;
    it_1 = (const_pointer)io::EpsCopyOutputStream::Encode64;
    local_108 = local_1d0;
    local_118 = (EpsCopyOutputStream *)
                io::EpsCopyOutputStream::EnsureSpace
                          ((EpsCopyOutputStream *)pSVar2,(uint8_t *)stream_local);
    local_d0 = pSVar2;
    local_d4 = local_fc;
    local_d8 = local_10c;
    local_40 = pSVar2;
    local_44 = local_fc;
    local_48 = 2;
    local_69 = 0;
    local_e0 = (_func_int **)local_118;
    local_50 = (_func_int **)local_118;
    if ((pSVar2->super_Message).super_MessageLite._vptr_MessageLite <= local_118) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_68,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      local_69 = 1;
      pLVar8 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_68);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_51,pLVar8);
    }
    if ((local_69 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_68);
    }
    local_38 = local_50;
    for (local_2c = local_44 << 3 | local_48; 0x7f < local_2c; local_2c = local_2c >> 7) {
      *(byte *)local_38 = (byte)local_2c | 0x80;
      local_38 = (_func_int **)((long)local_38 + 1);
    }
    local_e0 = (_func_int **)((long)local_38 + 1);
    *(byte *)local_38 = (byte)local_2c;
    local_18 = (EpsCopyOutputStream *)local_e0;
    for (local_c = local_d8; 0x7f < local_c; local_c = local_c >> 7) {
      *(byte *)local_18 = (byte)local_c | 0x80;
      local_18 = (EpsCopyOutputStream *)((long)local_18 + 1);
    }
    local_118 = (EpsCopyOutputStream *)((long)local_18 + 1);
    *(byte *)local_18 = (byte)local_c;
    local_38 = local_e0;
    local_18 = local_118;
    piVar7 = RepeatedField<int>::data(local_108);
    end_1 = piVar7;
    iVar6 = RepeatedField<int>::size(local_108);
    local_130 = piVar7 + iVar6;
    do {
      local_118 = (EpsCopyOutputStream *)
                  io::EpsCopyOutputStream::EnsureSpace
                            ((EpsCopyOutputStream *)pSVar2,(uint8_t *)local_118);
      iVar6 = *end_1;
      end_1 = end_1 + 1;
      local_e8 = (*(code *)it_1)((long)iVar6);
      local_f0 = local_118;
      for (; 0x7f < local_e8; local_e8 = local_e8 >> 7) {
        *(byte *)local_f0 = (byte)local_e8 | 0x80;
        local_f0 = (EpsCopyOutputStream *)((long)local_f0 + 1);
      }
      local_118 = (EpsCopyOutputStream *)((long)local_f0 + 1);
      *(byte *)local_f0 = (byte)local_e8;
      pEVar4 = local_118;
      local_f0 = local_118;
    } while (end_1 < local_130);
  }
  stream_local = pEVar4;
  puVar9 = internal::HasBits<1>::operator[](&(_byte_size->field_0)._impl_._has_bits_,0);
  byte_size_1 = *puVar9;
  if ((byte_size_1 & 1U) != 0) {
    local_258 = _internal_leading_comments_abi_cxx11_(_byte_size);
    pcVar10 = (char *)std::__cxx11::string::data();
    iVar6 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_268,"google.protobuf.SourceCodeInfo.Location.leading_comments");
    internal::WireFormat::VerifyUTF8StringNamedField(pcVar10,iVar6,SERIALIZE,local_268);
    pSVar2 = this_;
    sVar11 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_258);
    local_270 = sVar11._M_str;
    _s_1 = (string *)sVar11._M_len;
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pSVar2,3,sVar11,(uint8_t *)stream_local);
  }
  if ((byte_size_1 & 2U) != 0) {
    local_280 = _internal_trailing_comments_abi_cxx11_(_byte_size);
    pcVar10 = (char *)std::__cxx11::string::data();
    iVar6 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_290,"google.protobuf.SourceCodeInfo.Location.trailing_comments");
    internal::WireFormat::VerifyUTF8StringNamedField(pcVar10,iVar6,SERIALIZE,local_290);
    pSVar2 = this_;
    _n = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_280);
    stream_local = (EpsCopyOutputStream *)
                   io::EpsCopyOutputStream::WriteStringMaybeAliased
                             ((EpsCopyOutputStream *)pSVar2,4,_n,(uint8_t *)stream_local);
  }
  s._4_4_ = 0;
  s._0_4_ = _internal_leading_detached_comments_size(_byte_size);
  for (; s._4_4_ < (int)s; s._4_4_ = s._4_4_ + 1) {
    this_00 = _internal_leading_detached_comments_abi_cxx11_(_byte_size);
    local_2b0 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::Get(this_00,s._4_4_);
    pcVar10 = (char *)std::__cxx11::string::data();
    iVar6 = std::__cxx11::string::length();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_2c0,"google.protobuf.SourceCodeInfo.Location.leading_detached_comments");
    internal::WireFormat::VerifyUTF8StringNamedField(pcVar10,iVar6,SERIALIZE,local_2c0);
    pSVar2 = this_;
    local_1f0 = this_;
    local_1f4 = 6;
    local_200 = local_2b0;
    size = (ptrdiff_t)stream_local;
    local_210 = std::__cxx11::string::size();
    pVar3 = size;
    bVar5 = true;
    if ((long)local_210 < 0x80) {
      pp_Var1 = (pSVar2->super_Message).super_MessageLite._vptr_MessageLite;
      iVar6 = io::EpsCopyOutputStream::TagSize(local_1f4 << 3);
      bVar5 = (long)pp_Var1 + (-(long)iVar6 - pVar3) + 0xf < (long)local_210;
    }
    num = local_1f4;
    if (bVar5) {
      sVar11 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_200);
      local_218 = sVar11._M_str;
      this_local = (SourceCodeInfo_Location *)sVar11._M_len;
      local_1e8 = (EpsCopyOutputStream *)
                  io::EpsCopyOutputStream::WriteStringOutline
                            ((EpsCopyOutputStream *)pSVar2,num,sVar11,(uint8_t *)size);
    }
    else {
      local_190 = (byte *)size;
      for (local_184 = local_1f4 << 3 | 2; 0x7f < local_184; local_184 = local_184 >> 7) {
        *local_190 = (byte)local_184 | 0x80;
        local_190 = local_190 + 1;
      }
      *local_190 = (byte)local_184;
      __dest = local_190 + 2;
      local_190[1] = (byte)local_210;
      size = (ptrdiff_t)__dest;
      local_190 = local_190 + 1;
      __src = (void *)std::__cxx11::string::data();
      memcpy(__dest,__src,local_210);
      local_1e8 = (EpsCopyOutputStream *)(size + local_210);
    }
    stream_local = local_1e8;
  }
  bVar5 = internal::InternalMetadata::have_unknown_fields
                    (&(_byte_size->super_Message).super_MessageLite._internal_metadata_);
  if (bVar5) {
    unknown_fields =
         internal::InternalMetadata::unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(_byte_size->super_Message).super_MessageLite._internal_metadata_,
                    UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,(EpsCopyOutputStream *)this_);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL SourceCodeInfo_Location::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const SourceCodeInfo_Location& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.SourceCodeInfo.Location)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated int32 path = 1 [packed = true];
  {
    int byte_size = this_._impl_._path_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          1, this_._internal_path(), byte_size, target);
    }
  }

  // repeated int32 span = 2 [packed = true];
  {
    int byte_size = this_._impl_._span_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          2, this_._internal_span(), byte_size, target);
    }
  }

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional string leading_comments = 3;
  if ((cached_has_bits & 0x00000001u) != 0) {
    const ::std::string& _s = this_._internal_leading_comments();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.SourceCodeInfo.Location.leading_comments");
    target = stream->WriteStringMaybeAliased(3, _s, target);
  }

  // optional string trailing_comments = 4;
  if ((cached_has_bits & 0x00000002u) != 0) {
    const ::std::string& _s = this_._internal_trailing_comments();
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(_s.data(), static_cast<int>(_s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.SourceCodeInfo.Location.trailing_comments");
    target = stream->WriteStringMaybeAliased(4, _s, target);
  }

  // repeated string leading_detached_comments = 6;
  for (int i = 0, n = this_._internal_leading_detached_comments_size(); i < n; ++i) {
    const auto& s = this_._internal_leading_detached_comments().Get(i);
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(s.data(), static_cast<int>(s.length()), ::google::protobuf::internal::WireFormat::SERIALIZE,
                                "google.protobuf.SourceCodeInfo.Location.leading_detached_comments");
    target = stream->WriteString(6, s, target);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.SourceCodeInfo.Location)
  return target;
}